

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test1(void)

{
  bool bVar1;
  undefined1 local_80 [8];
  vector<int> w2;
  vector<int> v2;
  undefined1 local_40 [8];
  vector<int> w;
  vector<int> v;
  
  CP::vector<int>::vector((vector<int> *)&w.mSize,10);
  CP::vector<int>::vector((vector<int> *)local_40,3);
  CP::vector<int>::vector((vector<int> *)&w2.mSize,(vector<int> *)&w.mSize);
  CP::vector<int>::vector((vector<int> *)local_80,(vector<int> *)local_40);
  CP::vector<int>::swap((vector<int> *)&w.mSize,(vector<int> *)local_40);
  bVar1 = CP::vector<int>::operator==((vector<int> *)&w.mSize,(vector<int> *)local_80);
  if ((bVar1) &&
     (bVar1 = CP::vector<int>::operator==((vector<int> *)local_40,(vector<int> *)&w2.mSize), bVar1))
  {
    v.mSize._7_1_ = true;
  }
  else {
    v.mSize._7_1_ = false;
  }
  CP::vector<int>::~vector((vector<int> *)local_80);
  CP::vector<int>::~vector((vector<int> *)&w2.mSize);
  CP::vector<int>::~vector((vector<int> *)local_40);
  CP::vector<int>::~vector((vector<int> *)&w.mSize);
  return v.mSize._7_1_;
}

Assistant:

bool test1() {
  CP::vector<int> v(10);
  CP::vector<int> w(3);

  CP::vector<int> v2(v);
  CP::vector<int> w2(w);
  v.swap(w);
  if (v == w2 && w == v2) return true;
  return false;
}